

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void BeginVisitCatch(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  Scope *this;
  bool bVar1;
  uint32 uVar2;
  uint index;
  ParseNodeCatch *pPVar3;
  FuncInfo *this_00;
  FuncInfo *func;
  Scope *scope;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  pPVar3 = ParseNode::AsParseNodeCatch(pnode);
  this = pPVar3->scope;
  this_00 = Scope::GetFunc(this);
  bVar1 = FuncInfo::GetCallsEval(this_00);
  if (!bVar1) {
    bVar1 = FuncInfo::GetChildCallsEval(this_00);
    if (!bVar1) {
      uVar2 = ByteCodeGenerator::GetFlags(byteCodeGenerator);
      if ((uVar2 & 0x404) == 0) goto LAB_00b6ab04;
    }
  }
  Scope::SetIsObject(this);
LAB_00b6ab04:
  index = FuncInfo::AcquireInnerScopeIndex(this_00);
  Scope::SetInnerScopeIndex(this,index);
  pPVar3 = ParseNode::AsParseNodeCatch(pnode);
  ByteCodeGenerator::PushScope(byteCodeGenerator,pPVar3->scope);
  return;
}

Assistant:

void BeginVisitCatch(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    Scope *scope = pnode->AsParseNodeCatch()->scope;
    FuncInfo *func = scope->GetFunc();

    if (func->GetCallsEval() || func->GetChildCallsEval() ||
        (byteCodeGenerator->GetFlags() & (fscrEval | fscrImplicitThis)))
    {
        scope->SetIsObject();
    }

    // Give this scope an index so its slots can be accessed via the index in the byte code,
    // not a register.
    scope->SetInnerScopeIndex(func->AcquireInnerScopeIndex());

    byteCodeGenerator->PushScope(pnode->AsParseNodeCatch()->scope);
}